

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option.hpp
# Opt level: O0

void __thiscall
pstore::command_line::
opt<std::__cxx11::string,pstore::command_line::parser<std::__cxx11::string,void>>::
opt<pstore::command_line::details::positional,pstore::command_line::usage,pstore::command_line::desc>
          (opt<std::__cxx11::string,pstore::command_line::parser<std::__cxx11::string,void>> *this,
          positional *mods,usage *mods_1,desc *mods_2)

{
  desc *mods_local_2;
  usage *mods_local_1;
  positional *mods_local;
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
  *this_local;
  
  option::option((option *)this);
  *(undefined ***)this = &PTR__opt_00237868;
  std::__cxx11::string::string((string *)(this + 0x88));
  parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>::
  parser((parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
          *)(this + 0xa8));
  apply_to_option<pstore::command_line::opt<std::__cxx11::string,pstore::command_line::parser<std::__cxx11::string,void>>&,pstore::command_line::details::positional_const&,pstore::command_line::usage_const&,pstore::command_line::desc_const&>
            ((opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
              *)this,mods,mods_1,mods_2);
  return;
}

Assistant:

explicit opt (Mods const &... mods)
                    : option () {
                apply_to_option (*this, mods...);
            }